

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

void __thiscall CWire::Delete(CWire *this)

{
  CWire *local_10;
  
  if ((this->super_CObject).m_pParent == (CObject *)0x0) {
    (this->super_CObject).m_Key = 0;
    (this->super_CObject).m_iProp = 0;
    (this->super_CObject).m_iState = 0;
    this->m_pPointE = (CPoint *)0x0;
    this->m_pPointS = (CPoint *)0x0;
    ClearSegmentList(this);
    local_10 = this;
    std::deque<CWire*,std::allocator<CWire*>>::emplace_back<CWire*>
              ((deque<CWire*,std::allocator<CWire*>> *)&m_InstancePool,&local_10);
    return;
  }
  __assert_fail("m_pParent==NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x2a5,"void CWire::Delete()");
}

Assistant:

void CWire::Delete()
{
	assert(m_pParent==NULL);
	m_iState	=	STATE_INVALID;
	m_iProp		=	PROP_INVALID;
	m_Key		=	0;

	m_pPointE	=	NULL;
	m_pPointS	=	NULL;

	ClearSegmentList();
	m_InstancePool.push(this);
}